

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_decoder.h
# Opt level: O0

_Bool rc_read_init(lzma_range_decoder *rc,uint8_t *in,size_t *in_pos,size_t in_size)

{
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_range_decoder *rc_local;
  
  while( true ) {
    if (rc->init_bytes_left == 0) {
      return true;
    }
    if (*in_pos == in_size) break;
    rc->code = rc->code << 8 | (uint)in[*in_pos];
    *in_pos = *in_pos + 1;
    rc->init_bytes_left = rc->init_bytes_left - 1;
  }
  return false;
}

Assistant:

static inline bool
rc_read_init(lzma_range_decoder *rc, const uint8_t *LZMA_RESTRICT in,
		size_t *LZMA_RESTRICT in_pos, size_t in_size)
{
	while (rc->init_bytes_left > 0) {
		if (*in_pos == in_size)
			return false;

		rc->code = (rc->code << 8) | in[*in_pos];
		++*in_pos;
		--rc->init_bytes_left;
	}

	return true;
}